

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O1

void BrotliCompressFragmentTwoPassImpl14
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  size_t __n;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t input_size_00;
  long *plVar5;
  long *__s1;
  long *plVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  long *input_00;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  uint32_t *puVar19;
  ulong uVar20;
  long *__s2;
  long *plVar21;
  size_t tail;
  bool bVar22;
  long *local_a0;
  uint8_t *local_90;
  
  input_00 = (long *)input;
  if (input_size != 0) {
    do {
      input_size_00 = 0x20000;
      if (input_size < 0x20000) {
        input_size_00 = input_size;
      }
      plVar5 = (long *)(input_size_00 + (long)input_00);
      local_a0 = input_00;
      puVar19 = command_buf;
      local_90 = literal_buf;
      if (0xf < input_size) {
        uVar20 = input_size - 0x10;
        if (input_size_00 - 6 < input_size - 0x10) {
          uVar20 = input_size_00 - 6;
        }
        plVar21 = (long *)(uVar20 + (long)input_00);
        plVar6 = (long *)((long)input_00 + 1);
        uVar20 = (ulong)(*(long *)((long)input_00 + 1) * 0x1e35a7bd0000) >> 0x32;
        iVar4 = -1;
        __s2 = (long *)literal_buf;
        do {
          if (plVar6 <= local_a0) {
            __assert_fail("next_emit < ip",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                          ,0x11d,
                          "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                         );
          }
          uVar10 = 0x20;
          do {
            __s1 = plVar6;
            if ((uint)uVar20 != (uint)((ulong)(*plVar6 * 0x1e35a7bd0000) >> 0x32)) {
LAB_001282f9:
              __assert_fail("hash == Hash(ip, shift)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                            ,0x123,
                            "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                           );
            }
            while( true ) {
              plVar6 = (long *)((ulong)(uVar10 >> 5) + (long)__s1);
              iVar14 = (int)input;
              iVar9 = (int)__s1;
              if (plVar21 < plVar6) {
                iVar1 = 7;
              }
              else {
                lVar12 = *plVar6;
                if (((((int)*__s1 == *(int *)((long)__s1 + -(long)iVar4)) &&
                     (__s2 = (long *)((long)__s1 + -(long)iVar4),
                     *(char *)((long)__s1 + 4) == *(char *)((long)__s2 + 4))) &&
                    (*(char *)((long)__s1 + 5) == *(char *)((long)__s2 + 5))) && (0 < iVar4)) {
                  table[uVar20] = iVar9 - iVar14;
                  iVar1 = 5;
                }
                else {
                  if ((long)table[uVar20] < 0) {
                    __assert_fail("candidate >= base_ip",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                                  ,0x131,
                                  "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                                 );
                  }
                  __s2 = (long *)(input + table[uVar20]);
                  if (__s1 <= __s2) {
                    __assert_fail("candidate < ip",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                                  ,0x132,
                                  "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                                 );
                  }
                  table[uVar20] = iVar9 - iVar14;
                  iVar1 = 0;
                }
                uVar20 = (ulong)(lVar12 * 0x1e35a7bd0000) >> 0x32;
              }
              if (iVar1 != 0) break;
              if ((((int)*__s1 == (int)*__s2) &&
                  (*(char *)((long)__s1 + 4) == *(char *)((long)__s2 + 4))) &&
                 (*(char *)((long)__s1 + 5) == *(char *)((long)__s2 + 5))) goto LAB_00127a6c;
              uVar10 = uVar10 + 1;
              __s1 = plVar6;
              if ((uint)uVar20 != (uint)((ulong)(*plVar6 * 0x1e35a7bd0000) >> 0x32))
              goto LAB_001282f9;
            }
            if (iVar1 != 5) goto LAB_00128048;
LAB_00127a6c:
            uVar10 = uVar10 + 1;
          } while (0x3fff0 < (long)__s1 - (long)__s2);
          uVar7 = (long)plVar5 + (-6 - (long)__s1);
          if (7 < uVar7) {
            uVar11 = uVar7 & 0xfffffffffffffff8;
            pcVar16 = (char *)((long)__s1 + uVar11 + 6);
            lVar12 = 0;
            uVar17 = 0;
LAB_00127ac0:
            uVar13 = *(ulong *)((char *)((long)__s1 + 6) + uVar17 * 8);
            uVar18 = *(ulong *)((long)__s2 + uVar17 * 8 + 6);
            if (uVar13 == uVar18) goto code_r0x00127ace;
            uVar18 = uVar18 ^ uVar13;
            uVar7 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            uVar17 = (uVar7 >> 3 & 0x1fffffff) - lVar12;
            goto LAB_00127af4;
          }
          uVar11 = 0;
          pcVar16 = (char *)((long)__s1 + 6);
LAB_0012805c:
          uVar7 = uVar7 & 7;
          uVar17 = uVar11;
          if (uVar7 != 0) {
            uVar13 = uVar11 | uVar7;
            do {
              uVar17 = uVar11;
              if (*(char *)((long)__s2 + uVar11 + 6) != *pcVar16) break;
              pcVar16 = pcVar16 + 1;
              uVar11 = uVar11 + 1;
              uVar7 = uVar7 - 1;
              uVar17 = uVar13;
            } while (uVar7 != 0);
          }
LAB_00127af4:
          __n = uVar17 + 6;
          iVar1 = bcmp(__s1,__s2,__n);
          if (iVar1 != 0) {
            __assert_fail("0 == memcmp(base, candidate, matched)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                          ,0x149,
                          "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                         );
          }
          uVar2 = iVar9 - (int)local_a0;
          uVar10 = uVar2;
          if (5 < uVar2) {
            if (uVar2 < 0x82) {
              uVar3 = uVar2 - 2;
              uVar10 = 0x1f;
              if (uVar3 != 0) {
                for (; uVar3 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              bVar8 = (char)(uVar10 ^ 0xffffffe0) + 0x1f;
              uVar15 = uVar3 >> (bVar8 & 0x1f);
              uVar10 = (uVar3 - (uVar15 << (bVar8 & 0x1f))) * 0x100 |
                       uVar15 + (uVar10 ^ 0xffffffe0) * 2 + 0x40;
            }
            else if (uVar2 < 0x842) {
              uVar10 = 0x1f;
              if (uVar2 - 0x42 != 0) {
                for (; uVar2 - 0x42 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              uVar10 = (((-1 << ((byte)uVar10 & 0x1f)) + uVar2 + -0x42) * 0x100 - (uVar10 ^ 0x1f)) +
                       0x29;
            }
            else {
              iVar9 = uVar2 * 0x100;
              if (uVar2 < 0x1842) {
                uVar10 = iVar9 - 0x841eb;
              }
              else if (uVar2 < 0x5842) {
                uVar10 = iVar9 - 0x1841ea;
              }
              else {
                uVar10 = iVar9 - 0x5841e9;
              }
            }
          }
          *puVar19 = uVar10;
          memcpy(local_90,local_a0,(long)(int)uVar2);
          uVar10 = 0x40;
          iVar9 = (int)((long)__s1 - (long)__s2);
          if (iVar4 != iVar9) {
            uVar3 = iVar9 + 3;
            uVar10 = 0x1f;
            if (uVar3 != 0) {
              for (; uVar3 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            bVar8 = 0x1e - (char)(uVar10 ^ 0x1f);
            bVar22 = (uVar3 >> (bVar8 & 0x1f) & 1) != 0;
            uVar10 = ((uVar3 - (bVar22 + 2 << (bVar8 & 0x1f))) * 0x100 | (uVar10 ^ 0x1f) * 2 ^ 0x3e)
                     + (uint)bVar22 + 0x4c;
            iVar4 = iVar9;
          }
          puVar19[1] = uVar10;
          if (__n < 0xc) {
            puVar19[2] = (int)__n + 0x14;
            lVar12 = 0xc;
          }
          else if (__n < 0x48) {
            uVar10 = 0x1f;
            uVar3 = (uint)(uVar17 - 2);
            if (uVar3 != 0) {
              for (; uVar3 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            bVar8 = (char)(uVar10 ^ 0xffffffe0) + 0x1f;
            uVar7 = uVar17 - 2 >> (bVar8 & 0x3f);
            puVar19[2] = (uVar3 - (int)(uVar7 << (bVar8 & 0x3f))) * 0x100 |
                         (int)uVar7 + (uVar10 ^ 0xffffffe0) * 2 + 0x5a;
            lVar12 = 0xc;
          }
          else {
            if (__n < 0x88) {
              uVar10 = ((uint)(uVar17 - 2) & 0x1f) << 8 | (int)(uVar17 - 2 >> 5) + 0x36U;
LAB_00127cd1:
              puVar19[2] = uVar10;
            }
            else {
              if (0x847 < __n) {
                uVar10 = (int)__n * 0x100 - 0x847c1;
                goto LAB_00127cd1;
              }
              uVar10 = (int)uVar17 - 0x42;
              iVar9 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                }
              }
              puVar19[2] = ((int)(-1L << ((byte)iVar9 & 0x3f)) + (int)uVar17 + -0x42) * 0x100 +
                           iVar9 + 0x34;
            }
            puVar19[3] = 0x40;
            lVar12 = 0x10;
          }
          plVar6 = (long *)((long)__s1 + uVar17 + 6);
          if (plVar6 < plVar21) {
            uVar7 = *(ulong *)((long)__s1 + uVar17 + 1);
            iVar9 = (int)plVar6 - iVar14;
            table[uVar7 * 0x1e35a7bd0000 >> 0x32] = iVar9 + -5;
            table[(uVar7 >> 8) * 0x1e35a7bd0000 >> 0x32] = iVar9 + -4;
            table[(uVar7 >> 0x10) * 0x1e35a7bd0000 >> 0x32] = iVar9 + -3;
            uVar7 = *(ulong *)((long)__s1 + uVar17 + 4);
            uVar11 = (uVar7 >> 0x10) * 0x1e35a7bd0000 >> 0x32;
            table[uVar7 * 0x1e35a7bd0000 >> 0x32] = iVar9 + -2;
            table[(uVar7 >> 8) * 0x1e35a7bd0000 >> 0x32] = iVar9 + -1;
            __s2 = (long *)(input + table[uVar11]);
            table[uVar11] = iVar9;
            iVar1 = 0;
          }
          else {
            iVar1 = 7;
          }
          local_90 = local_90 + (int)uVar2;
          puVar19 = (uint32_t *)((long)puVar19 + lVar12);
          __s1 = plVar6;
          local_a0 = plVar6;
          if (plVar6 < plVar21) {
            lVar12 = (long)plVar6 - (long)__s2;
            iVar9 = iVar4;
            if ((lVar12 < 0x3fff1) && ((int)*plVar6 == (int)*__s2)) {
              while ((iVar4 = (int)lVar12, *(char *)((long)plVar6 + 4) == *(char *)((long)__s2 + 4)
                     && (*(char *)((long)plVar6 + 5) == *(char *)((long)__s2 + 5)))) {
                uVar7 = (long)plVar5 + (-6 - (long)plVar6);
                if (7 < uVar7) {
                  uVar17 = uVar7 & 0xfffffffffffffff8;
                  pcVar16 = (char *)((long)plVar6 + uVar17 + 6);
                  lVar12 = 0;
                  uVar11 = 0;
LAB_00127e10:
                  uVar13 = *(ulong *)((char *)((long)plVar6 + 6) + uVar11 * 8);
                  uVar18 = *(ulong *)((long)__s2 + uVar11 * 8 + 6);
                  if (uVar13 == uVar18) goto code_r0x00127e1e;
                  uVar18 = uVar18 ^ uVar13;
                  uVar7 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  uVar11 = (uVar7 >> 3 & 0x1fffffff) - lVar12;
                  goto LAB_00127e40;
                }
                uVar17 = 0;
                pcVar16 = (char *)((long)plVar6 + 6);
LAB_00127fe7:
                uVar7 = uVar7 & 7;
                uVar11 = uVar17;
                if (uVar7 != 0) {
                  uVar13 = uVar17 | uVar7;
                  do {
                    uVar11 = uVar17;
                    if (*(char *)((long)__s2 + uVar17 + 6) != *pcVar16) break;
                    pcVar16 = pcVar16 + 1;
                    uVar17 = uVar17 + 1;
                    uVar7 = uVar7 - 1;
                    uVar11 = uVar13;
                  } while (uVar7 != 0);
                }
LAB_00127e40:
                uVar7 = uVar11 + 6;
                iVar9 = bcmp(plVar6,__s2,uVar7);
                if (iVar9 != 0) {
                  __assert_fail("0 == memcmp(base, candidate, matched)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                                ,0x17a,
                                "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                               );
                }
                if (uVar7 < 10) {
                  uVar10 = (int)uVar7 + 0x26;
                }
                else {
                  uVar10 = (uint)uVar11;
                  if (uVar7 < 0x86) {
                    uVar2 = 0x1f;
                    if (uVar10 != 0) {
                      for (; uVar10 >> uVar2 == 0; uVar2 = uVar2 - 1) {
                      }
                    }
                    bVar8 = (char)(uVar2 ^ 0xffffffe0) + 0x1f;
                    uVar7 = uVar11 >> (bVar8 & 0x3f);
                    uVar10 = (uVar10 - (int)(uVar7 << (bVar8 & 0x3f))) * 0x100 |
                             (int)uVar7 + (uVar2 ^ 0xffffffe0) * 2 + 0x6a;
                  }
                  else if (uVar7 < 0x846) {
                    iVar9 = 0x1f;
                    if (uVar10 - 0x40 != 0) {
                      for (; uVar10 - 0x40 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                      }
                    }
                    uVar10 = iVar9 + ((int)(-1L << ((byte)iVar9 & 0x3f)) + uVar10 + -0x40) * 0x100 +
                             0x34;
                  }
                  else {
                    uVar10 = (int)uVar7 * 0x100 - 0x845c1;
                  }
                }
                local_a0 = (long *)((long)plVar6 + uVar11 + 6);
                *puVar19 = uVar10;
                uVar2 = iVar4 + 3;
                uVar10 = 0x1f;
                if (uVar2 != 0) {
                  for (; uVar2 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                bVar8 = 0x1e - (char)(uVar10 ^ 0x1f);
                bVar22 = (uVar2 >> (bVar8 & 0x1f) & 1) != 0;
                puVar19[1] = ((uVar2 - (bVar22 + 2 << (bVar8 & 0x1f))) * 0x100 |
                             (uVar10 ^ 0x1f) * 2 ^ 0x3e) + (uint)bVar22 + 0x4c;
                if (local_a0 < plVar21) {
                  uVar7 = *(ulong *)((long)plVar6 + uVar11 + 1);
                  iVar9 = (int)local_a0 - iVar14;
                  table[uVar7 * 0x1e35a7bd0000 >> 0x32] = iVar9 + -5;
                  table[(uVar7 >> 8) * 0x1e35a7bd0000 >> 0x32] = iVar9 + -4;
                  table[(uVar7 >> 0x10) * 0x1e35a7bd0000 >> 0x32] = iVar9 + -3;
                  uVar7 = *(ulong *)((long)plVar6 + uVar11 + 4);
                  uVar11 = (uVar7 >> 0x10) * 0x1e35a7bd0000 >> 0x32;
                  table[uVar7 * 0x1e35a7bd0000 >> 0x32] = iVar9 + -2;
                  table[(uVar7 >> 8) * 0x1e35a7bd0000 >> 0x32] = iVar9 + -1;
                  __s2 = (long *)(input + table[uVar11]);
                  table[uVar11] = iVar9;
                  iVar1 = 0;
                }
                else {
                  iVar1 = 7;
                }
                puVar19 = puVar19 + 2;
                __s1 = local_a0;
                if (plVar21 <= local_a0) goto LAB_00128048;
                lVar12 = (long)local_a0 - (long)__s2;
                plVar6 = local_a0;
                iVar9 = iVar4;
                if ((0x3fff0 < lVar12) || ((int)*local_a0 != (int)*__s2)) break;
              }
            }
            iVar4 = iVar9;
            uVar20 = (ulong)(*(long *)((long)plVar6 + 1) * 0x1e35a7bd0000) >> 0x32;
            iVar1 = 0;
            __s1 = (long *)((long)plVar6 + 1);
            local_a0 = plVar6;
          }
LAB_00128048:
          plVar6 = __s1;
        } while (iVar1 == 0);
      }
      if (plVar5 < local_a0) {
        __assert_fail("next_emit <= ip_end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                      ,0x19f,
                      "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                     );
      }
      if (local_a0 < plVar5) {
        uVar10 = (uint)((long)plVar5 - (long)local_a0);
        if (5 < uVar10) {
          if (uVar10 < 0x82) {
            uVar10 = uVar10 - 2;
            uVar2 = 0x1f;
            if (uVar10 != 0) {
              for (; uVar10 >> uVar2 == 0; uVar2 = uVar2 - 1) {
              }
            }
            bVar8 = (char)(uVar2 ^ 0xffffffe0) + 0x1f;
            uVar3 = uVar10 >> (bVar8 & 0x1f);
            uVar10 = (uVar10 - (uVar3 << (bVar8 & 0x1f))) * 0x100 |
                     uVar3 + (uVar2 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar10 < 0x842) {
            uVar2 = 0x1f;
            if (uVar10 - 0x42 != 0) {
              for (; uVar10 - 0x42 >> uVar2 == 0; uVar2 = uVar2 - 1) {
              }
            }
            uVar10 = (((-1 << ((byte)uVar2 & 0x1f)) + uVar10 + -0x42) * 0x100 - (uVar2 ^ 0x1f)) +
                     0x29;
          }
          else if (uVar10 < 0x1842) {
            uVar10 = uVar10 * 0x100 - 0x841eb;
          }
          else if (uVar10 < 0x5842) {
            uVar10 = uVar10 * 0x100 - 0x1841ea;
          }
          else {
            uVar10 = uVar10 * 0x100 - 0x5841e9;
          }
        }
        *puVar19 = uVar10;
        puVar19 = puVar19 + 1;
        uVar20 = (long)plVar5 - (long)local_a0 & 0xffffffff;
        memcpy(local_90,local_a0,uVar20);
        local_90 = local_90 + uVar20;
      }
      iVar4 = ShouldCompress((uint8_t *)input_00,input_size_00,(long)local_90 - (long)literal_buf);
      if (iVar4 == 0) {
        BrotliStoreMetaBlockHeader(input_size_00,1,storage_ix,storage);
        uVar10 = (int)*storage_ix + 7;
        *storage_ix = (ulong)(uVar10 & 0xfffffff8);
        memcpy(storage + (uVar10 >> 3),input_00,input_size_00);
        uVar20 = input_size_00 * 8 + *storage_ix;
        *storage_ix = uVar20;
        storage[uVar20 >> 3] = '\0';
      }
      else {
        BrotliStoreMetaBlockHeader(input_size_00,0,storage_ix,storage);
        uVar20 = *storage_ix;
        uVar7 = uVar20 >> 3;
        *(ulong *)(storage + uVar7) = (ulong)storage[uVar7];
        *storage_ix = uVar20 + 0xd;
        StoreCommands(m,literal_buf,(long)local_90 - (long)literal_buf,command_buf,
                      (long)puVar19 - (long)command_buf >> 2,storage_ix,storage);
      }
      input_size = input_size - input_size_00;
      input_00 = plVar5;
    } while (input_size != 0);
  }
  if (is_last != 0) {
    uVar7 = *storage_ix;
    *(ulong *)(storage + (uVar7 >> 3)) = (ulong)storage[uVar7 >> 3] | 1L << ((byte)uVar7 & 7);
    uVar20 = uVar7 + 1;
    *storage_ix = uVar20;
    *(ulong *)(storage + (uVar20 >> 3)) = (ulong)storage[uVar20 >> 3] | 1L << ((byte)uVar20 & 7);
    *storage_ix = (ulong)((int)uVar7 + 9U & 0xfffffff8);
  }
  return;
code_r0x00127ace:
  uVar17 = uVar17 + 1;
  lVar12 = lVar12 + -8;
  if (uVar7 >> 3 == uVar17) goto LAB_0012805c;
  goto LAB_00127ac0;
code_r0x00127e1e:
  uVar11 = uVar11 + 1;
  lVar12 = lVar12 + -8;
  if (uVar7 >> 3 == uVar11) goto LAB_00127fe7;
  goto LAB_00127e10;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: assert(0); break;
  }
}